

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeSelect
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,vector<wasm::Type,_std::allocator<wasm::Type>_> *res)

{
  uint pos_00;
  Index pos_01;
  size_type sVar1;
  ulong pos_02;
  reference __t;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_f8 [12];
  Result<wasm::Ok> local_e8;
  undefined1 local_c0 [12];
  Result<wasm::Ok> local_b0;
  allocator<char> local_71;
  string local_70;
  Err local_50;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_30;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *res_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *pPStack_18;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  local_30 = res;
  res_local = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)annotations;
  annotations_local._4_4_ = pos;
  pPStack_18 = this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  if ((res != (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x0) &&
     (sVar1 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(res), sVar1 != 0)) {
    sVar1 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(local_30);
    pos_00 = annotations_local._4_4_;
    if (1 < sVar1) {
      pos_02 = (ulong)annotations_local._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"select may not have more than one result type",&local_71);
      Lexer::err(&local_50,&this->in,pos_02,&local_70);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_50);
      wasm::Err::~Err(&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      return __return_storage_ptr__;
    }
    __t = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[](local_30,0);
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>((optional<wasm::Type> *)local_c0,__t);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_c0._0_8_
    ;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_c0[8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_c0._9_3_;
    IRBuilder::makeSelect(&local_b0,&this->irBuilder,type);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos_00,&local_b0);
    Result<wasm::Ok>::~Result(&local_b0);
    return __return_storage_ptr__;
  }
  pos_01 = annotations_local._4_4_;
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_f8);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_f8._0_8_;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_f8[8];
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_f8._9_3_;
  IRBuilder::makeSelect(&local_e8,&this->irBuilder,type_00);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos_01,&local_e8);
  Result<wasm::Ok>::~Result(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSelect(Index pos,
                      const std::vector<Annotation>& annotations,
                      std::vector<Type>* res) {
    if (res && res->size()) {
      if (res->size() > 1) {
        return in.err(pos, "select may not have more than one result type");
      }
      return withLoc(pos, irBuilder.makeSelect((*res)[0]));
    }
    return withLoc(pos, irBuilder.makeSelect());
  }